

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&,char_const(&)[30],kj::LogSeverity&,kj::StringPtr&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugExpression<bool_&> *params,char (*params_1) [30],LogSeverity *params_2,
          StringPtr *params_3)

{
  undefined4 in_register_00000014;
  char (*params_00) [30];
  LogSeverity *params_01;
  StringPtr *params_02;
  long lVar1;
  String argValues [4];
  
  this->exception = (Exception *)0x0;
  str<kj::_::DebugExpression<bool&>&>
            (argValues,(kj *)params,(DebugExpression<bool_&> *)CONCAT44(in_register_00000014,line));
  str<char_const(&)[30]>(argValues + 1,(kj *)params_1,params_00);
  str<kj::LogSeverity&>(argValues + 2,(kj *)params_2,params_01);
  str<kj::StringPtr&>(argValues + 3,(kj *)params_3,params_02);
  init(this,(EVP_PKEY_CTX *)file);
  lVar1 = 0x48;
  do {
    Array<char>::~Array((Array<char> *)((long)&argValues[0].content.ptr + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}